

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

_Bool buy_stat(wchar_t choice,int *stats_local,int *points_spent_local,int *points_inc_local,
              int *points_left_local,_Bool update_display)

{
  long lVar1;
  wchar_t remaining;
  wchar_t wVar2;
  
  if ((uint)choice < 5) {
    lVar1 = (long)stats[(uint)choice];
    if (lVar1 < 0x12) {
      wVar2 = birth_stat_costs[lVar1 + 1];
      if (wVar2 != points_inc[(uint)choice]) {
        __assert_fail("stat_cost == points_inc_local[choice]",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                      ,0x2e7,"_Bool buy_stat(int, int *, int *, int *, int *, _Bool)");
      }
      remaining = points_left - wVar2;
      if (wVar2 <= points_left) {
        stats[(uint)choice] = stats[(uint)choice] + 1;
        points_spent[(uint)choice] = points_spent[(uint)choice] + wVar2;
        points_inc[(uint)choice] = birth_stat_costs[lVar1 + 2];
        if ((char)stats_local == '\0') {
          points_left = remaining;
          return true;
        }
        wVar2 = L'\x002e2a10';
        points_left = remaining;
        event_signal_birthpoints(points_spent,points_inc,remaining);
        recalculate_stats((int *)(ulong)(uint)points_left,wVar2);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool buy_stat(int choice, int stats_local[STAT_MAX],
		int points_spent_local[STAT_MAX],
		int points_inc_local[STAT_MAX],
		int *points_left_local, bool update_display)
{
	/* Must be a valid stat, and have a "base" of below 18 to be adjusted */
	if (!(choice >= STAT_MAX || choice < 0) &&	(stats_local[choice] < 18)) {
		/* Get the cost of buying the extra point (beyond what
		   it has already cost to get this far). */
		int stat_cost = birth_stat_costs[stats_local[choice] + 1];

		assert(stat_cost == points_inc_local[choice]);
		if (stat_cost <= *points_left_local) {
			stats_local[choice]++;
			points_spent_local[choice] += stat_cost;
			points_inc_local[choice] =
				birth_stat_costs[stats_local[choice] + 1];
			*points_left_local -= stat_cost;

			if (update_display) {
				/* Tell the UI the new points situation. */
				event_signal_birthpoints(points_spent_local,
					points_inc_local, *points_left_local);

				/* Recalculate everything that's changed because
				   the stat has changed, and inform the UI. */
				recalculate_stats(stats_local, *points_left_local);
			}

			return true;
		}
	}

	/* Didn't adjust stat. */
	return false;
}